

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qteamcitylogger.cpp
# Opt level: O0

void __thiscall
QTeamCityLogger::tcEscapedString(QTeamCityLogger *this,QTestCharBuffer *buf,char *str)

{
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  char *in_RDX;
  QTestCharBuffer *in_RSI;
  char ch;
  char *p;
  bool swallowSpace;
  char *p_1;
  size_t size;
  undefined8 in_stack_ffffffffffffffb8;
  char *pcVar4;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  char cVar5;
  char *local_38;
  char *local_28;
  char *local_18;
  
  qstrlen((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  for (local_28 = in_RDX; *local_28 != '\0'; local_28 = local_28 + 1) {
    strchr("\n\r|[]\'",(int)*local_28);
  }
  QTestCharBuffer::resize
            ((QTestCharBuffer *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
  bVar1 = true;
  local_38 = QTestCharBuffer::data(in_RSI);
  local_18 = in_RDX;
  do {
    if (*local_18 == '\0') {
      if ((bVar1) && (pcVar4 = local_38, pcVar3 = QTestCharBuffer::data(in_RSI), pcVar3 < pcVar4)) {
        local_38 = local_38 + -1;
      }
      *local_38 = '\0';
      return;
    }
    cVar5 = *local_18;
    if (cVar5 == '\n') {
      *local_38 = '|';
      cVar5 = 'n';
      bVar1 = false;
      local_38 = local_38 + 1;
LAB_00142354:
      *local_38 = cVar5;
      local_38 = local_38 + 1;
    }
    else {
      if (cVar5 == '\r') {
        *local_38 = '|';
        cVar5 = 'r';
        bVar1 = false;
        local_38 = local_38 + 1;
        goto LAB_00142354;
      }
      if ((((cVar5 == '\'') || (cVar5 == '[')) || (cVar5 == ']')) || (cVar5 == '|')) {
        *local_38 = '|';
        bVar1 = false;
        local_38 = local_38 + 1;
        goto LAB_00142354;
      }
      bVar2 = ascii_isspace('\0');
      if (!bVar2) {
        bVar1 = false;
        goto LAB_00142354;
      }
      if (!bVar1) {
        bVar1 = true;
        cVar5 = ' ';
        goto LAB_00142354;
      }
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

void QTeamCityLogger::tcEscapedString(QTestCharBuffer *buf, const char *str) const
{
    {
        size_t size = qstrlen(str) + 1;
        for (const char *p = str; *p; ++p) {
            if (strchr("\n\r|[]'", *p))
                ++size;
        }
        Q_ASSERT(size <= size_t(INT_MAX));
        buf->resize(int(size));
    }

    bool swallowSpace = true;
    char *p = buf->data();
    for (; *str; ++str) {
        char ch = *str;
        switch (ch) {
        case '\n':
            p++[0] = '|';
            ch = 'n';
            swallowSpace = false;
            break;
        case '\r':
            p++[0] = '|';
            ch = 'r';
            swallowSpace = false;
            break;
        case '|':
        case '[':
        case ']':
        case '\'':
            p++[0] = '|';
            swallowSpace = false;
            break;
        default:
            if (ascii_isspace(ch)) {
                if (swallowSpace)
                    continue;
                swallowSpace = true;
                ch = ' ';
            } else {
                swallowSpace = false;
            }
            break;
        }
        p++[0] = ch;
    }
    Q_ASSERT(p < buf->data() + buf->size());
    if (swallowSpace && p > buf->data()) {
        Q_ASSERT(p[-1] == ' ');
        --p;
    }
    Q_ASSERT(p == buf->data() || !ascii_isspace(p[-1]));
    *p = '\0';
}